

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::LennardJonesAdapter::makeLennardJones
          (LennardJonesAdapter *this,RealType sigma,RealType epsilon,bool isSoft)

{
  AtomType *this_00;
  bool bVar1;
  LJAtypeParameters ljParam;
  undefined1 local_59;
  SimpleTypeData<OpenMD::LJAtypeParameters> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  RealType local_48;
  RealType local_40;
  shared_ptr<OpenMD::GenericData> local_38;
  LJAtypeParameters local_28;
  
  local_48 = epsilon;
  local_40 = sigma;
  bVar1 = AtomType::hasProperty(this->at_,(string *)LJtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)LJtypeID_abi_cxx11_);
  }
  local_28.epsilon = local_48;
  local_28.sigma = local_40;
  local_28._17_7_ = 0;
  local_28.isSoft = isSoft;
  this_00 = this->at_;
  local_58 = (SimpleTypeData<OpenMD::LJAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>>,std::__cxx11::string_const&,OpenMD::LJAtypeParameters&>
            (&_Stack_50,&local_58,
             (allocator<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *)&local_59,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             LJtypeID_abi_cxx11_,&local_28);
  local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_GenericData;
  local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (SimpleTypeData<OpenMD::LJAtypeParameters> *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_38);
  if (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

void LennardJonesAdapter::makeLennardJones(RealType sigma, RealType epsilon,
                                             bool isSoft) {
    if (isLennardJones()) { at_->removeProperty(LJtypeID); }

    LJAtypeParameters ljParam {};
    ljParam.epsilon = epsilon;
    ljParam.sigma   = sigma;
    ljParam.isSoft  = isSoft;

    at_->addProperty(std::make_shared<LJAtypeData>(LJtypeID, ljParam));
  }